

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

void __thiscall HEkk::initialisePartitionedRowwiseMatrix(HEkk *this)

{
  if ((this->status_).has_ar_matrix == false) {
    HighsSimplexAnalysis::simplexTimerStart(&this->analysis_,0x16,0);
    HighsSparseMatrix::createRowwisePartitioned
              (&this->ar_matrix_,&(this->lp_).a_matrix_,
               (this->basis_).nonbasicFlag_.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    HighsSimplexAnalysis::simplexTimerStop(&this->analysis_,0x16,0);
    (this->status_).has_ar_matrix = true;
  }
  return;
}

Assistant:

void HEkk::initialisePartitionedRowwiseMatrix() {
  if (status_.has_ar_matrix) return;
  analysis_.simplexTimerStart(matrixSetupClock);
  ar_matrix_.createRowwisePartitioned(lp_.a_matrix_,
                                      basis_.nonbasicFlag_.data());
  assert(ar_matrix_.debugPartitionOk(basis_.nonbasicFlag_.data()));
  analysis_.simplexTimerStop(matrixSetupClock);
  status_.has_ar_matrix = true;
}